

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtelnet.c
# Opt level: O1

void telnet_begin_zmp(telnet_t *telnet,char *cmd)

{
  size_t sVar1;
  uchar sb [3];
  char local_3b [3];
  telnet_event_t local_38;
  
  local_38.data.buffer = local_3b;
  local_3b[0] = -1;
  local_3b[1] = -6;
  local_3b[2] = 0x5d;
  local_38.type = TELNET_EV_SEND;
  local_38.data.size = 3;
  (*telnet->eh)(telnet,&local_38,telnet->ud);
  sVar1 = strlen(cmd);
  telnet_send(telnet,cmd,sVar1 + 1);
  return;
}

Assistant:

void telnet_begin_zmp(telnet_t *telnet, const char *cmd) {
	telnet_begin_sb(telnet, TELNET_TELOPT_ZMP);
	telnet_zmp_arg(telnet, cmd);
}